

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGraphVizWriter.cxx
# Opt level: O3

void __thiscall cmGraphVizWriter::WriteTargetDependersFiles(cmGraphVizWriter *this,char *fileName)

{
  _Rb_tree_header *p_Var1;
  uint uVar2;
  bool bVar3;
  TargetType targetType;
  ostream *poVar4;
  _Base_ptr p_Var5;
  cmGraphVizWriter *this_00;
  string currentFilename;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  insertedNodes;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  insertedConnections;
  cmGeneratedFileStream str;
  string local_300;
  char *local_2e0;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_2d8;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_2a8;
  undefined1 local_278 [584];
  
  if (this->GenerateDependers == true) {
    local_2e0 = fileName;
    CollectTargetsAndLibs(this);
    p_Var5 = (this->TargetPtrs)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    p_Var1 = &(this->TargetPtrs)._M_t._M_impl.super__Rb_tree_header;
    if ((_Rb_tree_header *)p_Var5 != p_Var1) {
      do {
        if (*(cmGeneratorTarget **)(p_Var5 + 2) != (cmGeneratorTarget *)0x0) {
          targetType = cmGeneratorTarget::GetType(*(cmGeneratorTarget **)(p_Var5 + 2));
          bVar3 = GenerateForTargetType(this,targetType);
          if (bVar3) {
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_300,local_2e0,(allocator<char> *)local_278);
            std::__cxx11::string::append((char *)&local_300);
            std::__cxx11::string::_M_append((char *)&local_300,*(ulong *)(p_Var5 + 1));
            std::__cxx11::string::append((char *)&local_300);
            cmGeneratedFileStream::cmGeneratedFileStream
                      ((cmGeneratedFileStream *)local_278,&local_300,false,None);
            uVar2 = *(uint *)(*(_func_int **)(local_278._0_8_ + -0x18) + (long)(local_278 + 0x20));
            if ((uVar2 & 5) == 0) {
              local_2a8._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
              local_2a8._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
              local_2a8._M_impl.super__Rb_tree_header._M_header._M_left =
                   &local_2a8._M_impl.super__Rb_tree_header._M_header;
              local_2a8._M_impl.super__Rb_tree_header._M_node_count = 0;
              local_2d8._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
              local_2d8._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
              local_2d8._M_impl.super__Rb_tree_header._M_header._M_left =
                   &local_2d8._M_impl.super__Rb_tree_header._M_header;
              local_2d8._M_impl.super__Rb_tree_header._M_node_count = 0;
              local_2d8._M_impl.super__Rb_tree_header._M_header._M_right =
                   local_2d8._M_impl.super__Rb_tree_header._M_header._M_left;
              local_2a8._M_impl.super__Rb_tree_header._M_header._M_right =
                   local_2a8._M_impl.super__Rb_tree_header._M_header._M_left;
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Writing ",8)
              ;
              poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                                 ((ostream *)&std::cout,local_300._M_dataplus._M_p,
                                  local_300._M_string_length);
              std::__ostream_insert<char,std::char_traits<char>>(poVar4,"...",3);
              std::ios::widen((char)poVar4->_vptr_basic_ostream[-3] + (char)poVar4);
              std::ostream::put((char)poVar4);
              std::ostream::flush();
              WriteHeader(this,(cmGeneratedFileStream *)local_278);
              this_00 = this;
              WriteDependerConnections
                        (this,(string *)(p_Var5 + 1),
                         (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)&local_2d8,
                         (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)&local_2a8,(cmGeneratedFileStream *)local_278);
              WriteFooter(this_00,(cmGeneratedFileStream *)local_278);
              std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~_Rb_tree(&local_2d8);
              std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~_Rb_tree(&local_2a8);
            }
            cmGeneratedFileStream::~cmGeneratedFileStream((cmGeneratedFileStream *)local_278);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_300._M_dataplus._M_p != &local_300.field_2) {
              operator_delete(local_300._M_dataplus._M_p,local_300.field_2._M_allocated_capacity + 1
                             );
            }
            if ((uVar2 & 5) != 0) {
              return;
            }
          }
        }
        p_Var5 = (_Base_ptr)std::_Rb_tree_increment(p_Var5);
      } while ((_Rb_tree_header *)p_Var5 != p_Var1);
    }
  }
  return;
}

Assistant:

void cmGraphVizWriter::WriteTargetDependersFiles(const char* fileName)
{
  if (!this->GenerateDependers) {
    return;
  }

  this->CollectTargetsAndLibs();

  for (auto const& ptr : this->TargetPtrs) {
    if (ptr.second == nullptr) {
      continue;
    }

    if (!this->GenerateForTargetType(ptr.second->GetType())) {
      continue;
    }

    std::string currentFilename = fileName;
    currentFilename += ".";
    currentFilename += ptr.first;
    currentFilename += ".dependers";

    cmGeneratedFileStream str(currentFilename);
    if (!str) {
      return;
    }

    std::set<std::string> insertedConnections;
    std::set<std::string> insertedNodes;

    std::cout << "Writing " << currentFilename << "..." << std::endl;
    this->WriteHeader(str);

    this->WriteDependerConnections(ptr.first, insertedNodes,
                                   insertedConnections, str);

    this->WriteFooter(str);
  }
}